

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<unsigned_int> *
wasm::WATParser::labelidx<wasm::WATParser::ParseDefsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx,bool inDelegate)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [8];
  MaybeResult<unsigned_int> _val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  MaybeResult<unsigned_int> idx;
  
  maybeLabelidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<unsigned_int> *)local_48,ctx,inDelegate)
  ;
  if (idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_48);
    _val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._32_8_ = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20),
               "expected label index or identifier","");
    Lexer::err((Err *)local_48,&ctx->in,
               (string *)
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err> = puVar1;
    puVar2 = (undefined1 *)
             ((long)&idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err> + 8);
    if (local_48 == (undefined1  [8])puVar2) {
      *puVar1 = CONCAT71(idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u.
                         _9_7_,idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>.
                               _M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x18) =
           idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = local_48;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                        super__Move_assign_alias<unsigned_int,_wasm::Err>.
                        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                        super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10) =
           CONCAT71(idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._9_7_,
                    idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 8) =
         idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._0_8_;
    idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._0_8_ = 0;
    idx.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._32_8_ != &local_58) {
      local_48 = (undefined1  [8])puVar2;
      operator_delete((void *)_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>.
                              _32_8_,local_58._M_allocated_capacity + 1);
    }
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_90,
                    (_Copy_ctor_base<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_48);
    if (_val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_90,
                 _val.val.super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err>._M_u._0_8_ +
                 (long)local_90);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = puVar1;
      if (local_b0 == &local_a0) {
        *puVar1 = local_a0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x18) = uStack_98;
      }
      else {
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err> = local_b0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x10) = local_a0;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 8) = local_a8;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_90);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_90);
      *(undefined4 *)
       &(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err> = local_48._0_4_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::None,_wasm::Err> *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LabelIdxT> labelidx(Ctx& ctx, bool inDelegate) {
  if (auto idx = maybeLabelidx(ctx, inDelegate)) {
    CHECK_ERR(idx);
    return *idx;
  }
  return ctx.in.err("expected label index or identifier");
}